

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChGaussPoint.cpp
# Opt level: O2

void __thiscall chrono::fea::ChGaussPoint::SetCoordinates(ChGaussPoint *this,ChVector<double> *c)

{
  double dVar1;
  ChVector<double> *pCVar2;
  
  pCVar2 = this->m_coordinates;
  if (pCVar2 == (ChVector<double> *)0x0) {
    pCVar2 = (ChVector<double> *)::operator_new(0x18);
    dVar1 = c->m_data[1];
    pCVar2->m_data[0] = c->m_data[0];
    pCVar2->m_data[1] = dVar1;
    pCVar2->m_data[2] = c->m_data[2];
    this->m_coordinates = pCVar2;
  }
  else if (pCVar2 != c) {
    pCVar2->m_data[0] = c->m_data[0];
    pCVar2->m_data[1] = c->m_data[1];
    pCVar2->m_data[2] = c->m_data[2];
  }
  return;
}

Assistant:

void ChGaussPoint::SetCoordinates(const ChVector<>& c) {
    if (m_coordinates) {
        *m_coordinates = c;
    } else {
        m_coordinates = new ChVector<>(c);
    }
}